

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O3

void QAnimationTimer::unregisterAnimation(QAbstractAnimation *animation)

{
  long *plVar1;
  int iVar2;
  QObject *obj;
  QObjectData *pQVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  QAbstractAnimation *in_RDI;
  long in_FS_OFFSET;
  QAbstractAnimation *local_40;
  void *local_38;
  char *pcStack_30;
  QMetaTypeInterface *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = in_RDI;
  lVar4 = __tls_get_addr(&PTR_006a9338);
  if (*(char *)(lVar4 + 0x80) == '\0') {
    unregisterAnimation();
  }
  obj = *(QObject **)(lVar4 + 0x78);
  if (obj != (QObject *)0x0) {
    unregisterRunningAnimation((QAnimationTimer *)obj,in_RDI);
    if (*(char *)((long)&(in_RDI->super_QObject).d_ptr.d[1].bindingStorage.d + 1) != '\x01')
    goto LAB_003a1f5e;
    pQVar3 = obj[3].d_ptr.d;
    if (pQVar3 != (QObjectData *)0x0) {
      iVar5 = 1;
      lVar6 = -0x100000000;
      lVar4 = 0;
      do {
        if ((long)pQVar3 << 3 == lVar4) goto LAB_003a1f3c;
        iVar5 = iVar5 + -1;
        lVar6 = lVar6 + 0x100000000;
        plVar1 = (long *)((long)obj[3]._vptr_QObject + lVar4);
        lVar4 = lVar4 + 8;
      } while ((QAbstractAnimation *)*plVar1 != in_RDI);
      if (iVar5 != 1) {
        QList<QAbstractAnimation_*>::removeAt
                  ((QList<QAbstractAnimation_*> *)&obj[2].d_ptr,lVar6 >> 0x20);
        iVar2 = *(int *)&obj[2]._vptr_QObject;
        if (SBORROW4(iVar2,-iVar5) == iVar2 + iVar5 < 0) {
          *(int *)&obj[2]._vptr_QObject = iVar2 + -1;
        }
        if ((obj[3].d_ptr.d == (QObjectData *)0x0) &&
           (*(char *)((long)&obj[2]._vptr_QObject + 6) == '\0')) {
          *(undefined1 *)((long)&obj[2]._vptr_QObject + 6) = 1;
          local_38 = (void *)0x0;
          pcStack_30 = (char *)0x0;
          local_28 = (QMetaTypeInterface *)0x0;
          QMetaObject::invokeMethodImpl
                    (obj,"stopTimer",QueuedConnection,1,&local_38,&pcStack_30,&local_28);
        }
        goto LAB_003a1f53;
      }
    }
LAB_003a1f3c:
    QtPrivate::sequential_erase_one<QList<QAbstractAnimation*>,QAbstractAnimation*>
              ((QList<QAbstractAnimation_*> *)(obj + 4),&local_40);
    in_RDI = local_40;
  }
LAB_003a1f53:
  *(undefined1 *)((long)&(in_RDI->super_QObject).d_ptr.d[1].bindingStorage.d + 1) = 0;
LAB_003a1f5e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAnimationTimer::unregisterAnimation(QAbstractAnimation *animation)
{
    QAnimationTimer *inst = QAnimationTimer::instance(false);
    if (inst) {
        //at this point the unified timer should have been created
        //but it might also have been already destroyed in case the application is shutting down

        inst->unregisterRunningAnimation(animation);

        if (!QAbstractAnimationPrivate::get(animation)->hasRegisteredTimer)
            return;

        int idx = inst->animations.indexOf(animation);
        if (idx != -1) {
            inst->animations.removeAt(idx);
            // this is needed if we unregister an animation while its running
            if (idx <= inst->currentAnimationIdx)
                --inst->currentAnimationIdx;

            if (inst->animations.isEmpty() && !inst->stopTimerPending) {
                inst->stopTimerPending = true;
                QMetaObject::invokeMethod(inst, "stopTimer", Qt::QueuedConnection);
            }
        } else {
            inst->animationsToStart.removeOne(animation);
        }
    }
    QAbstractAnimationPrivate::get(animation)->hasRegisteredTimer = false;
}